

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

void Pdr_SetPrintStr(Vec_Str_t *vStr,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  void *__src;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  __src = malloc((long)(nRegs + 1));
  uVar4 = 0;
  uVar6 = (ulong)(uint)nRegs;
  if (nRegs < 1) {
    uVar6 = uVar4;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined1 *)((long)__src + uVar4) = 0x2d;
  }
  *(undefined1 *)((long)__src + uVar6) = 0;
  for (lVar7 = 0; lVar7 < p->nLits; lVar7 = lVar7 + 1) {
    if (*(int *)(&p->field_0x14 + lVar7 * 4) != -1) {
      iVar1 = Abc_LitIsCompl(*(int *)(&p->field_0x14 + lVar7 * 4));
      uVar2 = Abc_Lit2Var(*(int *)(&p->field_0x14 + lVar7 * 4));
      *(byte *)((long)__src + (ulong)uVar2) = iVar1 == 0 | 0x30;
    }
  }
  if (vFlopCounts == (Vec_Int_t *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    for (lVar7 = 0; lVar5 = (long)iVar1, lVar7 < vFlopCounts->nSize; lVar7 = lVar7 + 1) {
      iVar3 = Vec_IntEntry(vFlopCounts,(int)lVar7);
      if (iVar3 != 0) {
        iVar1 = iVar1 + 1;
        *(undefined1 *)((long)__src + lVar5) = *(undefined1 *)((long)__src + lVar7);
      }
    }
    *(undefined1 *)((long)__src + lVar5) = 0;
  }
  iVar3 = vStr->nSize;
  if (vStr->nCap < iVar3 + iVar1) {
    Vec_StrGrow(vStr,(iVar3 + iVar1) * 2);
    iVar3 = vStr->nSize;
  }
  memcpy(vStr->pArray + iVar3,__src,(long)iVar1);
  vStr->nSize = vStr->nSize + iVar1;
  Vec_StrPush(vStr,' ');
  Vec_StrPush(vStr,'1');
  Vec_StrPush(vStr,'\n');
  free(__src);
  return;
}

Assistant:

void Pdr_SetPrintStr( Vec_Str_t * vStr, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k = 0, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[Abc_Lit2Var(p->Lits[i])] = (Abc_LitIsCompl(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    Vec_StrPushBuffer( vStr, pBuff, k );
    Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '1' );
    Vec_StrPush( vStr, '\n' );
    ABC_FREE( pBuff );
}